

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmBinUtilsMacOSMachOLinker.cxx
# Opt level: O0

bool __thiscall
cmBinUtilsMacOSMachOLinker::ScanDependencies
          (cmBinUtilsMacOSMachOLinker *this,string *file,TargetType type)

{
  bool bVar1;
  ulong uVar2;
  string local_b0;
  undefined1 local_90 [8];
  string executablePath;
  undefined1 local_40 [8];
  string executableFile;
  TargetType type_local;
  string *file_local;
  cmBinUtilsMacOSMachOLinker *this_local;
  
  executableFile.field_2._12_4_ = type;
  std::__cxx11::string::string((string *)local_40);
  if (executableFile.field_2._12_4_ == 0) {
    std::__cxx11::string::operator=((string *)local_40,(string *)file);
  }
  else {
    cmRuntimeDependencyArchive::GetBundleExecutable_abi_cxx11_
              ((string *)((long)&executablePath.field_2 + 8),(this->super_cmBinUtilsLinker).Archive)
    ;
    std::__cxx11::string::operator=
              ((string *)local_40,(string *)(executablePath.field_2._M_local_buf + 8));
    std::__cxx11::string::~string((string *)(executablePath.field_2._M_local_buf + 8));
  }
  std::__cxx11::string::string((string *)local_90);
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    cmsys::SystemTools::GetFilenamePath(&local_b0,(string *)local_40);
    std::__cxx11::string::operator=((string *)local_90,(string *)&local_b0);
    std::__cxx11::string::~string((string *)&local_b0);
  }
  bVar1 = ScanDependencies(this,file,(string *)local_90);
  std::__cxx11::string::~string((string *)local_90);
  std::__cxx11::string::~string((string *)local_40);
  return bVar1;
}

Assistant:

bool cmBinUtilsMacOSMachOLinker::ScanDependencies(
  std::string const& file, cmStateEnums::TargetType type)
{
  std::string executableFile;
  if (type == cmStateEnums::EXECUTABLE) {
    executableFile = file;
  } else {
    executableFile = this->Archive->GetBundleExecutable();
  }
  std::string executablePath;
  if (!executableFile.empty()) {
    executablePath = cmSystemTools::GetFilenamePath(executableFile);
  }
  return this->ScanDependencies(file, executablePath);
}